

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

bool cinemo::getWaveFiles
               (string *dir,
               vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_> *workFiles)

{
  char *__s;
  pointer *pppLVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  iterator __position;
  bool bVar3;
  DIR *__dirp;
  dirent *pdVar4;
  size_t sVar5;
  LameWrapper *this;
  LameWrapper *local_58;
  string local_50;
  
  __dirp = opendir((dir->_M_dataplus)._M_p);
  if (__dirp == (DIR *)0x0) {
    bVar3 = false;
  }
  else {
    pdVar4 = readdir(__dirp);
    if (pdVar4 != (dirent *)0x0) {
      paVar2 = &local_50.field_2;
      do {
        __s = pdVar4->d_name;
        local_50._M_dataplus._M_p = (pointer)paVar2;
        sVar5 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,__s,pdVar4->d_name + sVar5);
        bVar3 = isValidFileType(&local_50,"wav");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != paVar2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if (bVar3) {
          this = (LameWrapper *)operator_new(0x90);
          local_50._M_dataplus._M_p = (pointer)paVar2;
          sVar5 = strlen(__s);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,__s,__s + sVar5);
          LameWrapper::LameWrapper(this,dir,&local_50);
          __position._M_current =
               (workFiles->
               super__Vector_base<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          local_58 = this;
          if (__position._M_current ==
              (workFiles->
              super__Vector_base<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<cinemo::LameWrapper*,std::allocator<cinemo::LameWrapper*>>::
            _M_realloc_insert<cinemo::LameWrapper*>
                      ((vector<cinemo::LameWrapper*,std::allocator<cinemo::LameWrapper*>> *)
                       workFiles,__position,&local_58);
          }
          else {
            *__position._M_current = this;
            pppLVar1 = &(workFiles->
                        super__Vector_base<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
            *pppLVar1 = *pppLVar1 + 1;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != paVar2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
        }
        pdVar4 = readdir(__dirp);
      } while (pdVar4 != (dirent *)0x0);
    }
    bVar3 = (workFiles->
            super__Vector_base<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>).
            _M_impl.super__Vector_impl_data._M_finish !=
            (workFiles->
            super__Vector_base<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  }
  return bVar3;
}

Assistant:

bool getWaveFiles(const string& dir, vector<LameWrapper*>& workFiles) {
        DIR* workDir = opendir(dir.c_str());
        if (workDir == nullptr) {
            return false;
        }

        dirent* dirIt;
        while ((dirIt = readdir(workDir)) != nullptr) {
            if (isValidFileType(dirIt->d_name, extWave)) {
                workFiles.push_back(new LameWrapper(dir, dirIt->d_name));
            }
        }

        return workFiles.size() > 0;
    }